

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getModuleHeaderKind(TokenKind kind)

{
  TokenKind kind_local;
  SyntaxKind local_4;
  
  switch(kind) {
  case InterfaceKeyword:
    local_4 = InterfaceHeader;
    break;
  default:
    local_4 = Unknown;
    break;
  case MacromoduleKeyword:
    local_4 = ModuleHeader;
    break;
  case ModuleKeyword:
    local_4 = ModuleHeader;
    break;
  case PackageKeyword:
    local_4 = PackageHeader;
    break;
  case ProgramKeyword:
    local_4 = ProgramHeader;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getModuleHeaderKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::MacromoduleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::ProgramKeyword: return SyntaxKind::ProgramHeader;
        case TokenKind::InterfaceKeyword: return SyntaxKind::InterfaceHeader;
        case TokenKind::PackageKeyword: return SyntaxKind::PackageHeader;
        default: return SyntaxKind::Unknown;
    }
}